

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iStack.h
# Opt level: O0

void __thiscall
Imaginer::Utils::iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_>::iStack
          (iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *this,int *size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *puVar4;
  iStack<Imaginer::Utils::iRpn::RPNnode> *piVar5;
  ulong uVar6;
  iStack<Imaginer::Utils::iRpn::RPNnode> *local_60;
  int local_1c;
  int *local_18;
  int *size_local;
  iStack<Imaginer::Utils::iStack<Imaginer::Utils::iRpn::RPNnode>_> *this_local;
  
  this->_size = *size;
  this->_top = -1;
  uVar2 = (ulong)this->_size;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
  uVar6 = uVar3 + 8;
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar3) {
    uVar6 = 0xffffffffffffffff;
  }
  local_18 = size;
  size_local = (int *)this;
  puVar4 = (ulong *)operator_new__(uVar6);
  *puVar4 = uVar2;
  piVar5 = (iStack<Imaginer::Utils::iRpn::RPNnode> *)(puVar4 + 1);
  if (uVar2 != 0) {
    local_60 = piVar5;
    do {
      local_1c = 0x400;
      iStack<Imaginer::Utils::iRpn::RPNnode>::iStack(local_60,&local_1c);
      local_60 = local_60 + 1;
    } while (local_60 != piVar5 + uVar2);
  }
  this->_data = piVar5;
  return;
}

Assistant:

iStack(const int& size = 1024):_size(size),_top(-1)
    {
        _data = new Type[_size];
    }